

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

size_t __thiscall
andres::
BinaryViewExpressionScalarSecond<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
::dimension(BinaryViewExpressionScalarSecond<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
            *this)

{
  size_t sVar1;
  BinaryViewExpressionScalarSecond<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  *this_local;
  
  sVar1 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->e_);
  return sVar1;
}

Assistant:

const std::size_t dimension() const 
        { return e_.dimension(); }